

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_clamp_ivec2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar2 = (uint)c->in[0].m_data[1];
  uVar3 = (uint)c->in[0].m_data[3];
  uVar1 = *(undefined8 *)c->in[1].m_data;
  uVar4 = (uint)(float)uVar1;
  uVar5 = (uint)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(c->in[2].m_data + 1);
  uVar6 = (uint)(float)uVar1;
  uVar7 = (uint)(float)((ulong)uVar1 >> 0x20);
  uVar8 = -(uint)((int)uVar2 < (int)uVar4);
  uVar9 = -(uint)((int)uVar3 < (int)uVar5);
  uVar10 = -(uint)((int)uVar2 < (int)uVar6);
  uVar11 = -(uint)((int)uVar3 < (int)uVar7);
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((float)(int)(~uVar8 & (~uVar10 & uVar6 | uVar2 & uVar10) | uVar4 & uVar8),
                (float)(int)(~uVar9 & (~uVar11 & uVar7 | uVar3 & uVar11) | uVar5 & uVar9));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }